

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VConst(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  timespec spec;
  timespec local_38;
  
  set_element_range(X,0,param_2 + -1,0.0);
  iVar4 = 1;
  clock_gettime(1,&local_38);
  lVar2 = local_38.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_38.tv_nsec;
  N_VConst(0x3ff0000000000000,X);
  sync_device(X);
  clock_gettime(1,&local_38);
  lVar3 = local_38.tv_sec - base_time_tv_sec;
  iVar1 = check_ans(1.0,X,param_2);
  if (iVar1 == 0) {
    if (myid == 0) {
      puts("PASSED test -- N_VConst ");
    }
    iVar4 = 0;
  }
  else {
    printf(">>> FAILED test -- N_VConst, Proc %d \n",(ulong)(uint)myid);
  }
  max_time(X,((double)local_38.tv_nsec / 1000000000.0 + (double)lVar3) -
             (dVar5 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VConst");
  }
  return iVar4;
}

Assistant:

int Test_N_VConst(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;

  /* fill vector data with zeros to prevent passing in the case where
     the input vector is a vector of ones */
  set_element_range(X, 0, local_length - 1, ZERO);

  start_time = get_time();
  N_VConst(ONE, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +1 */
  failure = check_ans(ONE, X, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VConst, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConst \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConst", maxt);

  return (fails);
}